

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomPointF::read(DomPointF *this,int __fd,void *__buf,size_t __nbytes)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  undefined4 in_register_00000034;
  QXmlStreamReader *this_00;
  long in_FS_OFFSET;
  QStringView other;
  QStringView other_00;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_78;
  QArrayDataPointer<char16_t> local_60;
  QStringView local_48;
  long local_38;
  
  this_00 = (QXmlStreamReader *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    while( true ) {
      bVar2 = QXmlStreamReader::hasError(this_00);
      if (bVar2) goto LAB_0015fb74;
      iVar3 = QXmlStreamReader::readNext();
      if (iVar3 != 4) break;
      local_48.m_size = -0x5555555555555556;
      local_48.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
      local_48 = (QStringView)QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s((QString *)&local_60,L"x",1);
      other.m_data = local_60.ptr;
      other.m_size = local_60.size;
      iVar3 = QStringView::compare(&local_48,other,CaseInsensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
      if (iVar3 == 0) {
        QXmlStreamReader::readElementText(&local_60,this_00,0);
        dVar1 = (double)QString::toDouble((bool *)&local_60);
        *(byte *)&this->m_children = (byte)this->m_children | 1;
        this->m_x = dVar1;
      }
      else {
        Qt::Literals::StringLiterals::operator____s((QString *)&local_60,L"y",1);
        other_00.m_data = local_60.ptr;
        other_00.m_size = local_60.size;
        iVar3 = QStringView::compare(&local_48,other_00,CaseInsensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
        if (iVar3 == 0) {
          QXmlStreamReader::readElementText(&local_60,this_00,0);
          dVar1 = (double)QString::toDouble((bool *)&local_60);
          *(byte *)&this->m_children = (byte)this->m_children | 2;
          this->m_y = dVar1;
        }
        else {
          local_78.a.m_size = 0x13;
          local_78.a.m_data = "Unexpected element ";
          local_78.b = &local_48;
          QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                    ((QString *)&local_60,&local_78);
          QXmlStreamReader::raiseError((QString *)this_00);
        }
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
  } while (iVar3 != 5);
LAB_0015fb74:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomPointF::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"x"_s, Qt::CaseInsensitive)) {
                setElementX(reader.readElementText().toDouble());
                continue;
            }
            if (!tag.compare(u"y"_s, Qt::CaseInsensitive)) {
                setElementY(reader.readElementText().toDouble());
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}